

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O0

ULONG __thiscall Diligent::anon_unknown_0::DxcBlobWrapper::AddRef(DxcBlobWrapper *this)

{
  long lVar1;
  atomic<long> *paVar2;
  DxcBlobWrapper *this_local;
  
  paVar2 = &this->m_RefCount;
  LOCK();
  lVar1 = (paVar2->super___atomic_base<long>)._M_i;
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  return lVar1 + 1;
}

Assistant:

AddRef(void) override final
    {
        return m_RefCount.fetch_add(1) + 1;
    }